

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mattran.c
# Opt level: O3

MATRIX mat_tran(MATRIX A)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  MATRIX ppdVar4;
  long lVar5;
  ulong uVar6;
  
  ppdVar4 = mat_creat(*(int *)((long)A + -4),*(int *)(A + -1),-1);
  if ((ppdVar4 != (MATRIX)0x0) && (iVar1 = *(int *)((long)A + -4), 0 < (long)iVar1)) {
    uVar2 = *(uint *)(A + -1);
    lVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = ppdVar4[lVar5];
        uVar6 = 0;
        do {
          pdVar3[uVar6] = A[uVar6][lVar5];
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return ppdVar4;
}

Assistant:

MATRIX mat_tran( MATRIX A )
{
	int	i, j;
	MATRIX	At;

	if ((At = mat_creat( MatCol(A), MatRow(A), UNDEFINED )) == NULL)
		return (NULL);

	/*
	*	Transposing ...
	*/
	for (i=0; i<MatCol(A); i++)
	for (j=0; j<MatRow(A); j++)
		{
		At[i][j] = A[j][i];
		}
	return (At);
}